

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O0

t_object * __thiscall
xemmai::t_engine::f_allocate_for_type<xemmai::t_derived<xemmai::t_type_of<xemmai::t_map>>>
          (t_engine *this,size_t a_fields)

{
  size_t sVar1;
  ulong a_size;
  long *in_FS_OFFSET;
  size_t a_fields_local;
  t_engine *this_local;
  t_object *p;
  t_object *local_30;
  t_object *p_1;
  t_object *local_10;
  
  sVar1 = t_object::f_align_for_fields(0x178);
  a_size = sVar1 + a_fields * 0x28 + 0x48;
  if (a_size < 0x81) {
    local_10 = *(t_object **)(*in_FS_OFFSET + -0x58);
    if (local_10 == (t_object *)0x0) {
      local_10 = t_heap<xemmai::t_object>::f_allocate_from<0ul,65536ul>
                           (&this->v_object__heap,&(this->v_object__heap).v_of0);
    }
    else {
      *(t_object **)(*in_FS_OFFSET + -0x58) = local_10->v_next;
    }
    local_30 = local_10;
  }
  else {
    local_30 = t_heap<xemmai::t_object>::f_allocate_medium(&this->v_object__heap,a_size);
  }
  local_30->v_next = (t_object *)0x0;
  return local_30;
}

Assistant:

t_object* f_allocate_for_type(size_t a_fields)
	{
		return f_allocate(t_object::f_align_for_fields(sizeof(T)) + (sizeof(std::pair<t_slot, t_svalue>) + sizeof(std::pair<t_object*, size_t>)) * a_fields);
	}